

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
adjust_freqs(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *freqs,uint32_t largest_sym,
            bool require_u16,uint32_t H_approx)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined8 uVar7;
  void *pvVar8;
  undefined8 uVar9;
  uint *puVar10;
  bool bVar11;
  pointer puVar12;
  uint *puVar13;
  undefined7 in_register_00000009;
  uint *puVar14;
  undefined4 in_register_00000014;
  ulong uVar15;
  long lVar16;
  long lVar17;
  size_t freqs_sum;
  size_type M;
  size_type __n;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  double dVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_XMM6 [16];
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  sorted_freqs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mapping;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  allocator_type local_a9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  double local_a0;
  uint32_t local_94;
  undefined4 local_90;
  value_type local_8c;
  undefined1 local_88 [16];
  long local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  double local_38;
  
  local_a0 = (double)CONCAT44(in_register_00000014,largest_sym);
  local_90 = (undefined4)CONCAT71(in_register_00000009,require_u16);
  puVar12 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar16 = (long)(freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar12;
  if (lVar16 == 0) {
    freqs_sum = 0;
    __n = 0;
  }
  else {
    lVar16 = lVar16 >> 3;
    auVar19 = vpbroadcastq_avx512f();
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar21 = vmovdqa64_avx512f(auVar26);
      auVar22 = vmovdqa64_avx512f(auVar25);
      auVar25 = vpbroadcastq_avx512f();
      auVar25 = vporq_avx512f(auVar25,auVar20);
      uVar6 = vpcmpuq_avx512f(auVar25,auVar19,2);
      auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar12 + uVar15));
      bVar3 = (byte)uVar6;
      auVar23._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar25._8_8_;
      auVar23._0_8_ = (ulong)(bVar3 & 1) * auVar25._0_8_;
      auVar23._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar25._16_8_;
      auVar23._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar25._24_8_;
      auVar23._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar25._32_8_;
      auVar23._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar25._40_8_;
      auVar23._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar25._48_8_;
      auVar23._56_8_ = (uVar6 >> 7) * auVar25._56_8_;
      auVar26 = vpaddq_avx512f(auVar23,auVar26);
      uVar7 = vptestmq_avx512f(auVar23,auVar23);
      auVar25 = vpmovm2q_avx512dq(uVar7);
      auVar25 = vpsubq_avx512f(auVar22,auVar25);
      uVar15 = uVar15 + 8;
    } while ((lVar16 + (ulong)(lVar16 == 0) + 7 & 0xfffffffffffffff8) != uVar15);
    auVar19 = vmovdqa64_avx512f(auVar26);
    auVar20._0_8_ = (ulong)(bVar3 & 1) * auVar19._0_8_ | (ulong)!(bool)(bVar3 & 1) * auVar21._0_8_;
    bVar11 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar20._8_8_ = (ulong)bVar11 * auVar19._8_8_ | (ulong)!bVar11 * auVar21._8_8_;
    bVar11 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar20._16_8_ = (ulong)bVar11 * auVar19._16_8_ | (ulong)!bVar11 * auVar21._16_8_;
    bVar11 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar20._24_8_ = (ulong)bVar11 * auVar19._24_8_ | (ulong)!bVar11 * auVar21._24_8_;
    bVar11 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar20._32_8_ = (ulong)bVar11 * auVar19._32_8_ | (ulong)!bVar11 * auVar21._32_8_;
    bVar11 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar20._40_8_ = (ulong)bVar11 * auVar19._40_8_ | (ulong)!bVar11 * auVar21._40_8_;
    bVar11 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar20._48_8_ = (ulong)bVar11 * auVar19._48_8_ | (ulong)!bVar11 * auVar21._48_8_;
    auVar20._56_8_ = (uVar6 >> 7) * auVar19._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar21._56_8_;
    auVar19 = vmovdqa64_avx512f(auVar25);
    auVar26._0_8_ = (ulong)(bVar3 & 1) * auVar19._0_8_ | (ulong)!(bool)(bVar3 & 1) * auVar22._0_8_;
    bVar11 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar26._8_8_ = (ulong)bVar11 * auVar19._8_8_ | (ulong)!bVar11 * auVar22._8_8_;
    bVar11 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar26._16_8_ = (ulong)bVar11 * auVar19._16_8_ | (ulong)!bVar11 * auVar22._16_8_;
    bVar11 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar26._24_8_ = (ulong)bVar11 * auVar19._24_8_ | (ulong)!bVar11 * auVar22._24_8_;
    bVar11 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar26._32_8_ = (ulong)bVar11 * auVar19._32_8_ | (ulong)!bVar11 * auVar22._32_8_;
    bVar11 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar26._40_8_ = (ulong)bVar11 * auVar19._40_8_ | (ulong)!bVar11 * auVar22._40_8_;
    bVar11 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar26._48_8_ = (ulong)bVar11 * auVar19._48_8_ | (ulong)!bVar11 * auVar22._48_8_;
    auVar26._56_8_ = (uVar6 >> 7) * auVar19._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar22._56_8_;
    auVar18 = vextracti64x4_avx512f(auVar26,1);
    auVar19 = vpaddq_avx512f(auVar26,ZEXT3264(auVar18));
    auVar4 = vpaddq_avx(auVar19._0_16_,auVar19._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddq_avx(auVar4,auVar5);
    __n = auVar4._0_8_;
    auVar18 = vextracti64x4_avx512f(auVar20,1);
    auVar19 = vpaddq_avx512f(auVar20,ZEXT3264(auVar18));
    auVar4 = vpaddq_avx(auVar19._0_16_,auVar19._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddq_avx(auVar4,auVar5);
    freqs_sum = auVar4._0_8_;
  }
  M = __n;
  if (((int)POPCOUNT(__n) != 1) && (M = 1L << ((ulong)(byte)-(char)LZCOUNT(__n) & 0x3f), __n == 0))
  {
    M = 1;
  }
  local_88 = (undefined1  [16])0x0;
  local_78 = 0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puVar12 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_a8 = freqs;
  local_94 = H_approx;
  if ((freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar12) {
    do {
      if (puVar12[(long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start] != 0) {
        std::
        vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>
        ::emplace_back<unsigned_long_const&,unsigned_long&>
                  ((vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>
                    *)local_88,
                   puVar12 + (long)local_68.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start,
                   (unsigned_long *)&local_68);
      }
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1);
      puVar12 = (local_a8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start <
             (pointer)((long)(local_a8->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3));
  }
  uVar7 = local_88._0_8_;
  uVar9 = local_88._8_8_;
  if (local_88._0_8_ != local_88._8_8_) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_int>*,std::vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_88._0_8_,local_88._8_8_,
               (int)LZCOUNT((long)(local_88._8_8_ - local_88._0_8_) >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_int>*,std::vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar7,uVar9);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,__n,(allocator_type *)&local_50);
  if (local_88._8_8_ - local_88._0_8_ != 0) {
    lVar16 = (long)(local_88._8_8_ - local_88._0_8_) >> 4;
    puVar13 = (uint *)(local_88._0_8_ + 8);
    lVar17 = 0;
    do {
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar17] = *puVar13;
      lVar17 = lVar17 + 1;
      puVar13 = puVar13 + 4;
    } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
  }
  local_38 = entropy<unsigned_long>(local_a8,freqs_sum);
  uVar15 = (ulong)(SUB84(local_a0,0) + 1);
  local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,uVar15,(value_type *)&local_50,(allocator_type *)&local_8c);
  local_8c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,uVar15,&local_8c,&local_a9);
  auVar4 = vcvtusi2sd_avx512f(in_XMM6,local_94);
  local_a0 = (auVar4._0_8_ / 1000.0 + 1.0) * local_38;
  do {
    while (bVar11 = scale_freqs(__return_storage_ptr__,local_a8,&local_68,M,__n,freqs_sum), bVar11)
    {
      M = M * 2;
    }
    puVar13 = (__return_storage_ptr__->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar14 = puVar13 + 1;
    if (puVar14 != puVar2 && puVar13 != puVar2) {
      do {
        puVar10 = puVar14;
        if (*puVar14 <= *puVar13) {
          puVar10 = puVar13;
        }
        puVar13 = puVar10;
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar2);
    }
    uVar1 = *puVar13;
    dVar24 = cross_entropy<unsigned_long,unsigned_int>(local_a8,__return_storage_ptr__);
    if (((char)local_90 == '\0') || (uVar1 < 0xffff)) {
      if (dVar24 < local_a0) goto LAB_001211bf;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&local_50,__return_storage_ptr__);
      M = M * 2;
      bVar11 = true;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (__return_storage_ptr__,&local_50);
LAB_001211bf:
      bVar11 = false;
    }
    if (!bVar11) {
      pvVar8 = (void *)CONCAT44(local_50.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_50.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,(long)local_50.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar8);
      }
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_88._0_8_ != (void *)0x0) {
        operator_delete((void *)local_88._0_8_,local_78 - local_88._0_8_);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<uint32_t> adjust_freqs(const std::vector<uint64_t>& freqs,
    uint32_t largest_sym, bool require_u16, uint32_t H_approx = 1)
{
    size_t sigma = 0;
    size_t freq_sum = 0;
    for (size_t i = 0; i < freqs.size(); i++) {
        freq_sum += freqs[i];
        sigma += (freqs[i] != 0);
    }
    size_t target_frame_size = sigma;
    if (!is_power_of_two(target_frame_size)) {
        target_frame_size = next_power_of_two(target_frame_size);
    }

    std::vector<std::pair<uint64_t, uint32_t>> sorted_freqs;
    for (size_t i = 0; i < freqs.size(); i++) {
        if ((freqs[i] != 0))
            sorted_freqs.emplace_back(freqs[i], i);
    }
    std::sort(sorted_freqs.begin(), sorted_freqs.end());
    std::vector<uint32_t> mapping(sigma);
    for (size_t i = 0; i < sorted_freqs.size(); i++)
        mapping[i] = sorted_freqs[i].second;

    auto H = entropy(freqs, freq_sum);
    std::vector<uint32_t> scaled(largest_sym + 1, 0);
    std::vector<uint32_t> prev(largest_sym + 1, 0);
    double approx_factor = 1.0 + double(H_approx) / double(1000);
    double threshold = H * approx_factor;
    uint32_t u16_limit = std::numeric_limits<uint16_t>::max();
    while (true) {
        if (scale_freqs(
                scaled, freqs, mapping, target_frame_size, sigma, freq_sum)) {
            target_frame_size *= 2;
            continue;
        }
        auto max_norm_freq = *std::max_element(scaled.begin(), scaled.end());
        auto XH = cross_entropy(freqs, scaled);

        // we want all freqs to be less than u16::max to have a compact
        // frame representation
        if (require_u16 && max_norm_freq >= u16_limit) {
            // std::cout << "abort due to u16 overflow" << std::endl;
            scaled = prev;
            break;
        }
        // std::cout << "sigma=" << sigma << " m=" << freq_sum << " M=" <<
        // target_frame_size << " H=" << H << " XH=" << XH << " max_freq= " <<
        // max_norm_freq << std::endl;
        if (XH < threshold) {
            break;
        }
        target_frame_size *= 2;
        prev = scaled;
    }

    return scaled;
}